

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O3

share_forwarding * share_find_forwarding(ssh_sharing_connstate *cs,char *host,int port)

{
  share_forwarding *psVar1;
  share_forwarding dummyfwd;
  char *local_30;
  int local_28;
  
  local_30 = dupstr(host);
  local_28 = port;
  psVar1 = (share_forwarding *)find234(cs->forwardings,&local_30,(cmpfn234)0x0);
  safefree(local_30);
  return psVar1;
}

Assistant:

static struct share_forwarding *share_find_forwarding
    (struct ssh_sharing_connstate *cs, const char *host, int port)
{
    struct share_forwarding dummyfwd, *ret;
    dummyfwd.host = dupstr(host);
    dummyfwd.port = port;
    ret = find234(cs->forwardings, &dummyfwd, NULL);
    sfree(dummyfwd.host);
    return ret;
}